

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.h
# Opt level: O3

bool asl::Directory::createOne(String *name)

{
  int iVar1;
  int *piVar2;
  anon_union_16_2_78e7fdac_for_String_2 *__path;
  bool bVar3;
  
  if (name->_size == 0) {
    __path = &name->field_2;
  }
  else {
    __path = (anon_union_16_2_78e7fdac_for_String_2 *)(name->field_2)._str;
  }
  iVar1 = mkdir(__path->_space,0x1ff);
  if (iVar1 == 0) {
    bVar3 = true;
  }
  else if (iVar1 < 0) {
    piVar2 = __errno_location();
    bVar3 = *piVar2 == 0x11;
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

const char* str() const {return (_size==0)? (const char*)_space : (const char*)_str;}